

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O2

void lograw(uchar *buffer,ssize_t len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char *format;
  int iVar5;
  long lVar6;
  long lVar7;
  char *buffer_00;
  char data [120];
  
  if (len < 1) {
    len = 0;
  }
  iVar5 = 0x78;
  buffer_00 = data;
  lVar7 = 0;
  lVar6 = 0;
  do {
    if (len == lVar7) {
      if (lVar6 != 0) {
        logmsg("\'%s\'",data);
      }
      return;
    }
    bVar1 = buffer[lVar7];
    if (bVar1 == 0xd) {
      format = "\\r";
LAB_00105ebb:
      curl_msnprintf(buffer_00,(long)iVar5,format);
      lVar3 = 2;
      iVar2 = -2;
    }
    else {
      if (bVar1 == 10) {
        format = "\\n";
        goto LAB_00105ebb;
      }
      iVar2 = Curl_isgraph((uint)bVar1);
      uVar4 = 0x2e;
      if (buffer[lVar7] == 0x20) {
        uVar4 = 0x20;
      }
      if (iVar2 != 0) {
        uVar4 = (ulong)buffer[lVar7];
      }
      curl_msnprintf(buffer_00,(long)iVar5,"%c",uVar4);
      lVar3 = 1;
      iVar2 = -1;
    }
    lVar6 = lVar6 + lVar3;
    if (lVar6 < 0x3d) {
      buffer_00 = buffer_00 + lVar3;
      iVar5 = iVar5 + iVar2;
    }
    else {
      buffer_00 = data;
      logmsg("\'%s\'",buffer_00);
      lVar6 = 0;
      iVar5 = 0x78;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void lograw(unsigned char *buffer, ssize_t len)
{
  char data[120];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len; i++) {
    switch(ptr[i]) {
    case '\n':
      snprintf(optr, left, "\\n");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    case '\r':
      snprintf(optr, left, "\\r");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    default:
      snprintf(optr, left, "%c", (ISGRAPH(ptr[i]) ||
                                  ptr[i] == 0x20) ?ptr[i]:'.');
      width++;
      optr++;
      left--;
      break;
    }

    if(width>60) {
      logmsg("'%s'", data);
      width = 0;
      optr = data;
      left = sizeof(data);
    }
  }
  if(width)
    logmsg("'%s'", data);
}